

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

locator * __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,256ul,16ul>>
::
nosize_unchecked_emplace_at<std::pair<std::basic_string_view<char,std::char_traits<char>>&&,std::pair<slang::syntax::ExpressionSyntax_const*,bool>&&>>
          (locator *__return_storage_ptr__,
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<slang::syntax::ExpressionSyntax_const*,bool>>,256ul,16ul>>
          *this,arrays_type *arrays_,size_t pos0,size_t hash,
          pair<std::basic_string_view<char,_std::char_traits<char>_>_&&,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_&&>
          *args)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  size_t *psVar3;
  undefined8 *puVar4;
  group_type_pointer pgVar5;
  value_type_pointer ppVar6;
  uint uVar7;
  ushort uVar8;
  byte bVar9;
  char *pcVar10;
  undefined8 uVar11;
  ulong uVar12;
  long lVar13;
  undefined1 auVar14 [16];
  
  uVar12 = arrays_->groups_size_mask;
  pgVar5 = arrays_->groups_;
  lVar13 = 1;
  while( true ) {
    pgVar1 = pgVar5 + pos0;
    pgVar2 = pgVar5 + pos0;
    bVar9 = pgVar2->m[0xf].n;
    auVar14[0] = -(pgVar2->m[0].n == '\0');
    auVar14[1] = -(pgVar2->m[1].n == '\0');
    auVar14[2] = -(pgVar2->m[2].n == '\0');
    auVar14[3] = -(pgVar2->m[3].n == '\0');
    auVar14[4] = -(pgVar2->m[4].n == '\0');
    auVar14[5] = -(pgVar2->m[5].n == '\0');
    auVar14[6] = -(pgVar2->m[6].n == '\0');
    auVar14[7] = -(pgVar2->m[7].n == '\0');
    auVar14[8] = -(pgVar2->m[8].n == '\0');
    auVar14[9] = -(pgVar2->m[9].n == '\0');
    auVar14[10] = -(pgVar2->m[10].n == '\0');
    auVar14[0xb] = -(pgVar2->m[0xb].n == '\0');
    auVar14[0xc] = -(pgVar2->m[0xc].n == '\0');
    auVar14[0xd] = -(pgVar2->m[0xd].n == '\0');
    auVar14[0xe] = -(pgVar2->m[0xe].n == '\0');
    auVar14[0xf] = -(bVar9 == 0);
    uVar8 = (ushort)(SUB161(auVar14 >> 7,0) & 1) | (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe;
    if (uVar8 != 0) break;
    pgVar1->m[0xf].n = bVar9 | '\x01' << ((byte)hash & 7);
    pos0 = pos0 + lVar13 & uVar12;
    lVar13 = lVar13 + 1;
  }
  uVar7 = 0;
  if (uVar8 != 0) {
    for (; (uVar8 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
    }
  }
  ppVar6 = arrays_->elements_;
  uVar12 = (ulong)(uVar7 << 5);
  pcVar10 = args->first->_M_str;
  psVar3 = (size_t *)((long)&ppVar6[pos0 * 0xf].first._M_len + uVar12);
  *psVar3 = args->first->_M_len;
  psVar3[1] = (size_t)pcVar10;
  uVar11 = *(undefined8 *)&args->second->second;
  puVar4 = (undefined8 *)((long)&ppVar6[pos0 * 0xf].second.first + uVar12);
  *puVar4 = args->second->first;
  puVar4[1] = uVar11;
  pgVar1->m[uVar7].n =
       *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                   ::word + ((uint)hash & 0xff));
  __return_storage_ptr__->pg = pgVar1;
  __return_storage_ptr__->n = uVar7;
  __return_storage_ptr__->p =
       (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_slang::syntax::ExpressionSyntax_*,_bool>_>
        *)((long)&ppVar6[pos0 * 0xf].first._M_len + uVar12);
  return __return_storage_ptr__;
}

Assistant:

locator nosize_unchecked_emplace_at(const arrays_type& arrays_, std::size_t pos0,
                                        std::size_t hash, Args&&... args) {
        for (prober pb(pos0);; pb.next(arrays_.groups_size_mask)) {
            auto pos = pb.get();
            auto pg = arrays_.groups() + pos;
            auto mask = pg->match_available();
            if (BOOST_LIKELY(mask != 0)) {
                auto n = unchecked_countr_zero(mask);
                auto p = arrays_.elements() + pos * N + n;
                construct_element(p, std::forward<Args>(args)...);
                pg->set(n, hash);
                BOOST_UNORDERED_ADD_STATS(cstats.insertion, (pb.length()));
                return {pg, n, p};
            }
            else
                pg->mark_overflow(hash);
        }
    }